

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O3

void __thiscall
glcts::anon_unknown_0::UniformLocImplicitInSomeStages3::~UniformLocImplicitInSomeStages3
          (UniformLocImplicitInSomeStages3 *this)

{
  deqp::SubcaseBase::~SubcaseBase((SubcaseBase *)this);
  operator_delete(this,0x38);
  return;
}

Assistant:

virtual long Run()
	{
		std::vector<Uniform> uniforms;

		//location only in fsh, declaration in all shaders, usage in all shaders but fsh.
		uniforms.push_back(Uniform(uniformValueGenerator, GL_FLOAT, Loc::C(3, DefOccurence::FSH_OR_CSH),
								   DefOccurence::ALL_SH, DefOccurence::ALL_BUT_FSH));

		//location in all but fsh, declaration in all shaders, usage in fsh.
		uniforms.push_back(Uniform(uniformValueGenerator, GL_FLOAT, Loc::C(2, DefOccurence::ALL_BUT_FSH),
								   DefOccurence::ALL_SH, DefOccurence::FSH_OR_CSH));

		//location only in fsh, declaration in all shaders, usage in all shaders but fsh.
		uniforms.push_back(Uniform(uniformValueGenerator, UniformType(GL_FLOAT, 3), Loc::C(7, DefOccurence::FSH_OR_CSH),
								   DefOccurence::ALL_SH, DefOccurence::ALL_BUT_FSH));

		//location in all but fsh, declaration in all shaders, usage in fsh.
		uniforms.push_back(Uniform(uniformValueGenerator, UniformType(GL_FLOAT, 3),
								   Loc::C(4, DefOccurence::ALL_BUT_FSH), DefOccurence::ALL_SH,
								   DefOccurence::FSH_OR_CSH));

		//location only in vsh, declaration in all shaders, usage in all shaders but vsh.
		uniforms.push_back(Uniform(uniformValueGenerator, GL_FLOAT, Loc::C(0, DefOccurence::VSH), DefOccurence::ALL_SH,
								   DefOccurence::ALL_BUT_VSH));

		//location only in vsh, declaration in all shaders, usage in all shaders but vsh.
		uniforms.push_back(Uniform(uniformValueGenerator, GL_FLOAT, Loc::C(1, DefOccurence::ALL_BUT_FSH),
								   DefOccurence::ALL_SH, DefOccurence::ALL_BUT_VSH));

		return doRun(uniforms);
	}